

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O1

void __thiscall Fl_Browser_::sort(Fl_Browser_ *this,int flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long local_48;
  long lVar8;
  undefined8 uVar9;
  
  iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  if (lVar8 != 0) {
    iVar3 = -2;
    do {
      iVar4 = iVar3;
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,lVar8);
      lVar8 = CONCAT44(extraout_var_00,iVar3);
      iVar3 = iVar4 + 1;
    } while (lVar8 != 0);
    if (-1 < iVar3) {
      iVar3 = iVar4 + 2;
      do {
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
        uVar9 = CONCAT44(extraout_var_01,iVar4);
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,uVar9);
        bVar2 = false;
        iVar4 = 1;
        local_48 = CONCAT44(extraout_var_02,iVar5);
        do {
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,uVar9);
          iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,local_48);
          iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_48);
          lVar8 = CONCAT44(extraout_var_05,iVar7);
          iVar5 = strcmp((char *)CONCAT44(extraout_var_03,iVar5),
                         (char *)CONCAT44(extraout_var_04,iVar6));
          if ((flags & 1U) == 0) {
            if (0 < iVar5) {
LAB_001b7ea1:
              (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x13])(this,uVar9,local_48);
              bVar2 = true;
            }
          }
          else if (iVar5 < 0) goto LAB_001b7ea1;
          if (lVar8 == 0) break;
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,lVar8);
          uVar9 = CONCAT44(extraout_var_06,iVar5);
          bVar1 = iVar4 < iVar3;
          iVar4 = iVar4 + 1;
          local_48 = lVar8;
        } while (bVar1);
      } while ((bVar2) && (bVar2 = 1 < iVar3, iVar3 = iVar3 + -1, bVar2));
    }
  }
  return;
}

Assistant:

void Fl_Browser_::sort(int flags) {
  //
  // Simple bubble sort - pure lazyness on my side.
  //
  int i, j, n = -1, desc = ((flags&FL_SORT_DESCENDING)==FL_SORT_DESCENDING);
  void *a =item_first(), *b, *c;
  if (!a) return;
  while (a) {
    a = item_next(a);
    n++;
  }
  for (i=n; i>0; i--) {
    char swapped = 0;
    a = item_first();
    b = item_next(a);
    for (j=0; j<i; j++) {
      const char *ta = item_text(a);
      const char *tb = item_text(b);
      c = item_next(b);
      if (desc) {
        if (strcmp(ta, tb)<0) {
          item_swap(a, b);
          swapped = 1;
        }
      } else {
        if (strcmp(ta, tb)>0) {
          item_swap(a, b);
          swapped = 1;
        }
      }
      if (!c) break;
      b = c; a = item_prev(b);
    }
    if (!swapped)
      break;
  }
}